

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O1

string * __thiscall
Chart::renderWeekday_abi_cxx11_
          (string *__return_storage_ptr__,Chart *this,Datetime *day,Color *color)

{
  uint uVar1;
  ostream *poVar2;
  int dow;
  stringstream out;
  char local_1e1;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  uVar1 = Datetime::dayOfWeek(day);
  Datetime::dayNameShort_abi_cxx11_(&local_1c0,(Datetime *)(ulong)uVar1,dow);
  Color::colorize(&local_1e0,color,&local_1c0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  local_1e1 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1e1,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderWeekday (Datetime& day, const Color& color)
{
  std::stringstream out;

  out << color.colorize (Datetime::dayNameShort (day.dayOfWeek ()))
      << ' ';

  return out.str ();
}